

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall
S2Polygon::InsertLoop(S2Polygon *this,S2Loop *new_loop,S2Loop *parent,LoopMap *loop_map)

{
  undefined8 *puVar1;
  S2Loop *this_00;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  vector<S2Loop*,std::allocator<S2Loop*>> *this_01;
  vector<S2Loop*,std::allocator<S2Loop*>> *this_02;
  S2Loop **ppSVar5;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *__range2;
  int iVar6;
  void *__src;
  iterator iVar7;
  ulong uVar8;
  undefined8 *puVar9;
  S2Loop *child;
  S2Loop *local_48;
  S2Loop *local_40;
  S2Loop *local_38;
  
  local_48 = new_loop;
  local_38 = parent;
  do {
    this_01 = (vector<S2Loop*,std::allocator<S2Loop*>> *)
              std::
              map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
              ::operator[](loop_map,&local_38);
    puVar1 = *(undefined8 **)(this_01 + 8);
    if (*(undefined8 **)this_01 == puVar1) break;
    bVar4 = true;
    puVar2 = *(undefined8 **)this_01;
    do {
      puVar9 = puVar2 + 1;
      this_00 = (S2Loop *)*puVar2;
      bVar3 = S2Loop::ContainsNested(this_00,local_48);
      if (bVar3) {
        bVar4 = false;
        local_38 = this_00;
      }
      puVar2 = puVar9;
    } while (!bVar3 && puVar9 != puVar1);
  } while (!bVar4);
  this_02 = (vector<S2Loop*,std::allocator<S2Loop*>> *)
            std::
            map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
            ::operator[](loop_map,&local_48);
  ppSVar5 = *(S2Loop ***)this_01;
  iVar7._M_current = *(S2Loop ***)(this_01 + 8);
  if (iVar7._M_current != ppSVar5) {
    uVar8 = 0;
    iVar6 = 0;
    do {
      local_40 = ppSVar5[uVar8];
      bVar4 = S2Loop::ContainsNested(local_48,local_40);
      if (bVar4) {
        iVar7._M_current = *(S2Loop ***)(this_02 + 8);
        if (iVar7._M_current == *(S2Loop ***)(this_02 + 0x10)) {
          std::vector<S2Loop*,std::allocator<S2Loop*>>::_M_realloc_insert<S2Loop*const&>
                    (this_02,iVar7,&local_40);
        }
        else {
          *iVar7._M_current = local_40;
          *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
        }
        __src = (void *)(*(long *)this_01 + uVar8 * 8 + 8);
        if (__src != *(void **)(this_01 + 8)) {
          memmove((void *)(*(long *)this_01 + uVar8 * 8),__src,
                  (long)*(void **)(this_01 + 8) - (long)__src);
        }
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + -8;
      }
      else {
        iVar6 = iVar6 + 1;
      }
      uVar8 = (ulong)iVar6;
      ppSVar5 = *(S2Loop ***)this_01;
      iVar7._M_current = *(S2Loop ***)(this_01 + 8);
    } while (uVar8 < (ulong)((long)iVar7._M_current - (long)ppSVar5 >> 3));
  }
  if (iVar7._M_current == *(S2Loop ***)(this_01 + 0x10)) {
    std::vector<S2Loop*,std::allocator<S2Loop*>>::_M_realloc_insert<S2Loop*const&>
              (this_01,iVar7,&local_48);
  }
  else {
    *iVar7._M_current = local_48;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
  }
  return;
}

Assistant:

void S2Polygon::InsertLoop(S2Loop* new_loop, S2Loop* parent,
                           LoopMap* loop_map) {
  vector<S2Loop*>* children;
  for (bool done = false; !done; ) {
    children = &(*loop_map)[parent];
    done = true;
    for (S2Loop* child : *children) {
      if (child->ContainsNested(new_loop)) {
        parent = child;
        done = false;
        break;
      }
    }
  }

  // Some of the children of the parent loop may now be children of
  // the new loop.
  vector<S2Loop*>* new_children = &(*loop_map)[new_loop];
  for (int i = 0; i < children->size();) {
    S2Loop* child = (*children)[i];
    if (new_loop->ContainsNested(child)) {
      new_children->push_back(child);
      children->erase(children->begin() + i);
    } else {
      ++i;
    }
  }
  children->push_back(new_loop);
}